

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Button::Button(Button *this,string *text)

{
  string *in_RSI;
  Widget *in_RDI;
  
  Widget::Widget(in_RDI);
  in_RDI->_vptr_Widget = (_func_int **)&PTR__Button_00113810;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined1 *)&in_RDI[1].x1 = 0;
  return;
}

Assistant:

Button::Button(std::string text):
   text(text),
   pushed(false)
{
}